

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_add_itext(LodePNGInfo *info,char *key,char *langtag,char *transkey,char *str)

{
  void *pvVar1;
  char *pcVar2;
  void *pvVar3;
  void *pvVar4;
  char *pcVar5;
  long in_RDI;
  char **new_strings;
  char **new_transkeys;
  char **new_langtags;
  char **new_keys;
  size_t in_stack_ffffffffffffffa8;
  void *in_stack_ffffffffffffffb0;
  undefined4 local_4;
  
  pvVar1 = lodepng_realloc(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  pcVar2 = (char *)lodepng_realloc(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  pvVar3 = lodepng_realloc(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  pvVar4 = lodepng_realloc(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if ((((pvVar1 == (void *)0x0) || (pcVar2 == (char *)0x0)) || (pvVar3 == (void *)0x0)) ||
     (pvVar4 == (void *)0x0)) {
    lodepng_free((void *)0x128f5a);
    lodepng_free((void *)0x128f64);
    lodepng_free((void *)0x128f6e);
    lodepng_free((void *)0x128f78);
    local_4 = 0x53;
  }
  else {
    *(long *)(in_RDI + 0x60) = *(long *)(in_RDI + 0x60) + 1;
    *(void **)(in_RDI + 0x68) = pvVar1;
    *(char **)(in_RDI + 0x70) = pcVar2;
    *(void **)(in_RDI + 0x78) = pvVar3;
    *(void **)(in_RDI + 0x80) = pvVar4;
    pcVar5 = alloc_string(pcVar2);
    *(char **)(*(long *)(in_RDI + 0x68) + (*(long *)(in_RDI + 0x60) + -1) * 8) = pcVar5;
    pcVar5 = alloc_string(pcVar2);
    *(char **)(*(long *)(in_RDI + 0x70) + (*(long *)(in_RDI + 0x60) + -1) * 8) = pcVar5;
    pcVar5 = alloc_string(pcVar2);
    *(char **)(*(long *)(in_RDI + 0x78) + (*(long *)(in_RDI + 0x60) + -1) * 8) = pcVar5;
    pcVar2 = alloc_string(pcVar2);
    *(char **)(*(long *)(in_RDI + 0x80) + (*(long *)(in_RDI + 0x60) + -1) * 8) = pcVar2;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

unsigned lodepng_add_itext(LodePNGInfo* info, const char* key, const char* langtag,
                           const char* transkey, const char* str) {
  char** new_keys = (char**)(lodepng_realloc(info->itext_keys, sizeof(char*) * (info->itext_num + 1)));
  char** new_langtags = (char**)(lodepng_realloc(info->itext_langtags, sizeof(char*) * (info->itext_num + 1)));
  char** new_transkeys = (char**)(lodepng_realloc(info->itext_transkeys, sizeof(char*) * (info->itext_num + 1)));
  char** new_strings = (char**)(lodepng_realloc(info->itext_strings, sizeof(char*) * (info->itext_num + 1)));
  if(!new_keys || !new_langtags || !new_transkeys || !new_strings) {
    lodepng_free(new_keys);
    lodepng_free(new_langtags);
    lodepng_free(new_transkeys);
    lodepng_free(new_strings);
    return 83; /*alloc fail*/
  }

  ++info->itext_num;
  info->itext_keys = new_keys;
  info->itext_langtags = new_langtags;
  info->itext_transkeys = new_transkeys;
  info->itext_strings = new_strings;

  info->itext_keys[info->itext_num - 1] = alloc_string(key);
  info->itext_langtags[info->itext_num - 1] = alloc_string(langtag);
  info->itext_transkeys[info->itext_num - 1] = alloc_string(transkey);
  info->itext_strings[info->itext_num - 1] = alloc_string(str);

  return 0;
}